

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool TwoBytesTest2<Blob<256>>(pfHash hash,int maxlen,bool drawDiagram)

{
  bool bVar1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  HashCallback<Blob<256>_> c;
  
  c.m_hashes = &hashes;
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  c.super_KeyCallback.m_count = 0;
  c.super_KeyCallback._vptr_KeyCallback = (_func_int **)&PTR__KeyCallback_001cce28;
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  c.m_pfHash = hash;
  TwoBytesKeygen(maxlen,&c.super_KeyCallback);
  bVar1 = TestHashList<Blob<256>>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  std::_Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>);
  return bVar1;
}

Assistant:

bool TwoBytesTest2 ( pfHash hash, int maxlen, bool drawDiagram )
{
  std::vector<hashtype> hashes;

  HashCallback<hashtype> c(hash,hashes);

  TwoBytesKeygen(maxlen,c);

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  return result;
}